

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O2

void __thiscall FPolyObj::UpdateBBox(FPolyObj *this)

{
  uint i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < (this->Linedefs).Count; uVar1 = uVar1 + 1) {
    P_AdjustLine((this->Linedefs).Array[uVar1]);
  }
  CalcCenter(this);
  return;
}

Assistant:

void FPolyObj::UpdateBBox ()
{
	for(unsigned i=0;i<Linedefs.Size(); i++)
	{
		P_AdjustLine(Linedefs[i]);
	}
	CalcCenter();
}